

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QMainWindowLayoutState::plug(QMainWindowLayoutState *this,QList<int> *path)

{
  long lVar1;
  int *piVar2;
  QLayoutItem *pQVar3;
  qsizetype in_RSI;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  int i;
  QList<int> *in_stack_ffffffffffffff90;
  QToolBarAreaLayout *this_00;
  QList<int> *path_00;
  QDockAreaLayout *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  path_00 = in_RDI;
  piVar2 = QList<int>::first(in_stack_ffffffffffffff90);
  if (*piVar2 == 0) {
    this_00 = (QToolBarAreaLayout *)(in_RDI + 1);
    QList<int>::mid((QList<int> *)in_stack_ffffffffffffffc0,(qsizetype)path_00,in_RSI);
    pQVar3 = QToolBarAreaLayout::plug(this_00,in_stack_ffffffffffffff90);
    QList<int>::~QList((QList<int> *)0x5f4838);
  }
  else if (*piVar2 == 1) {
    QList<int>::mid((QList<int> *)in_stack_ffffffffffffffc0,(qsizetype)path_00,in_RSI);
    pQVar3 = QDockAreaLayout::plug(in_stack_ffffffffffffffc0,path_00);
    QList<int>::~QList((QList<int> *)0x5f488a);
  }
  else {
    pQVar3 = (QLayoutItem *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QMainWindowLayoutState::plug(const QList<int> &path)
{
    int i = path.first();

#if QT_CONFIG(toolbar)
    if (i == 0)
        return toolBarAreaLayout.plug(path.mid(1));
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        return dockAreaLayout.plug(path.mid(1));
#endif // QT_CONFIG(dockwidget)

    return nullptr;
}